

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O2

int __thiscall pele::physics::turbinflow::TurbInflow::init(TurbInflow *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  ostream *os_;
  Print *pPVar5;
  istream *piVar6;
  istream *piVar7;
  FArrayBox *this_00;
  Arena *ar;
  pointer pTVar8;
  int *ptr;
  long lVar9;
  long lVar10;
  int n;
  ulong uVar11;
  int i;
  int i_1;
  ulong uVar12;
  double dVar13;
  double dVar14;
  Array<int,_3> npts;
  Array<int,_3> iper;
  Array<amrex::Real,_3> probsize;
  long local_390;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tp_list;
  Real rdummy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  Vector<double,_std::allocator<double>_> turb_center;
  string side;
  string turb_header;
  ParmParse pp;
  ParmParse ppr;
  ifstream is;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [31];
  
  _is = (pointer)local_228;
  local_228[0]._M_local_buf[0] = '\0';
  amrex::ParmParse::ParmParse(&ppr,(string *)&is);
  std::__cxx11::string::~string((string *)&is);
  uVar3 = amrex::ParmParse::countval(&ppr,"turbinflows",-1);
  tp_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tp_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tp_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
    std::
    vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
    ::resize((vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
              *)this,uVar12);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&tp_list.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,uVar12);
    lVar9 = 0;
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      amrex::ParmParse::get
                (&ppr,"turbinflows",
                 (string *)
                 ((long)&((tp_list.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9),
                 (int)uVar11);
      lVar9 = lVar9 + 0x20;
    }
  }
  uVar12 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar12 = 0;
  }
  local_390 = 0x60;
  for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is,
                   "turbinflow.",
                   tp_list.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11);
    amrex::ParmParse::ParmParse(&pp,(string *)&is);
    std::__cxx11::string::~string((string *)&is);
    iVar4 = amrex::ParmParse::countval(&pp,"turb_file",-1);
    if (0 < iVar4) {
      amrex::ParmParse::query
                (&pp,"turb_file",
                 &(this->tp).
                  super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                  .
                  super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].m_turb_file,0);
      ptr = (int *)((long)((this->tp).
                           super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                           .
                           super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar11) + 0x90);
      *ptr = -1;
      amrex::ParmParse::query(&pp,"dir",ptr,0);
      side._M_dataplus._M_p = (pointer)&side.field_2;
      side._M_string_length = 0;
      side.field_2._M_local_buf[0] = '\0';
      amrex::ParmParse::query(&pp,"side",&side,0);
      bVar1 = std::operator==(&side,"low");
      if (bVar1) {
        pTVar8 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(Side *)((long)(pTVar8 + uVar11) + 0x94) = low;
      }
      else {
        bVar1 = std::operator==(&side,"high");
        if (bVar1) {
          pTVar8 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(Side *)((long)(pTVar8 + uVar11) + 0x94) = high;
        }
        else {
          amrex::Abort_host("turbinflow.side can only be low or high");
          pTVar8 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      amrex::ParmParse::query(&pp,"time_offset",(Real *)((long)(pTVar8 + uVar11) + 0x98),0);
      amrex::ParmParse::query
                (&pp,"turb_scale_loc",
                 (Real *)((long)((this->tp).
                                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 .
                                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar11) + 200),0);
      amrex::ParmParse::query
                (&pp,"turb_scale_vel",
                 (Real *)((long)((this->tp).
                                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 .
                                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar11) + 0xd0),0);
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)&is,os_);
      std::operator<<((ostream *)local_228[0]._M_local_buf,"Initializing turbInflow ");
      std::operator<<((ostream *)local_228[0]._M_local_buf,
                      (string *)
                      (tp_list.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar11));
      std::operator<<((ostream *)local_228[0]._M_local_buf," with file ");
      std::operator<<((ostream *)local_228[0]._M_local_buf,
                      (string *)
                      ((this->tp).
                       super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       .
                       super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar11));
      std::operator<<((ostream *)local_228[0]._M_local_buf,
                      " (location coordinates in will be scaled by ");
      pPVar5 = amrex::Print::operator<<
                         ((Print *)&is,
                          (Real *)((long)((this->tp).
                                          super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                          .
                                          super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar11) + 200)
                         );
      std::operator<<((ostream *)&pPVar5->ss," and velocity out to be scaled by ");
      pPVar5 = amrex::Print::operator<<
                         (pPVar5,(Real *)((long)((this->tp).
                                                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                                 .
                                                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar11)
                                         + 0xd0));
      std::operator<<((ostream *)&pPVar5->ss,") \n");
      amrex::Print::~Print((Print *)&is);
      _is = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&turb_center.super_vector<double,_std::allocator<double>_>,2,
                 (value_type_conflict2 *)&is,(allocator_type *)&turb_header);
      amrex::ParmParse::getarr
                (&pp,"turb_center",&turb_center.super_vector<double,_std::allocator<double>_>,0,-1);
      lVar9 = (long)turb_center.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)turb_center.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      pTVar8 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
        turb_center.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar10] = *(Real *)((long)(pTVar8 + uVar11) + 200) *
                   turb_center.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      }
      amrex::ParmParse::query
                (&pp,"turb_nplane",
                 (int *)((long)((this->tp).
                                super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                .
                                super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11) + 0xa0),0);
      amrex::ParmParse::query
                (&pp,"turb_conv_vel",
                 (Real *)((long)((this->tp).
                                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 .
                                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar11) + 0xd8),0);
      std::operator+(&turb_header,
                     &(this->tp).
                      super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                      .
                      super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].m_turb_file,"/HDR");
      std::ifstream::ifstream((Print *)&is,turb_header._M_dataplus._M_p,_S_in);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        std::operator+(&local_360,"Unable to open input file ",&turb_header);
        amrex::Abort(&local_360);
        std::__cxx11::string::~string((string *)&local_360);
      }
      npts._M_elems[2] = 0;
      npts._M_elems[0] = 0;
      npts._M_elems[1] = 0;
      probsize._M_elems[2] = 0.0;
      iper._M_elems[2] = 0;
      probsize._M_elems[0] = 0.0;
      probsize._M_elems[1] = 0.0;
      iper._M_elems[0] = 0;
      iper._M_elems[1] = 0;
      piVar6 = (istream *)std::istream::operator>>((istream *)&is,npts._M_elems);
      piVar6 = (istream *)std::istream::operator>>(piVar6,npts._M_elems + 1);
      std::istream::operator>>(piVar6,npts._M_elems + 2);
      piVar7 = std::istream::_M_extract<double>((double *)&is);
      piVar7 = std::istream::_M_extract<double>((double *)piVar7);
      std::istream::_M_extract<double>((double *)piVar7);
      piVar6 = (istream *)std::istream::operator>>((istream *)&is,iper._M_elems);
      piVar6 = (istream *)std::istream::operator>>(piVar6,iper._M_elems + 1);
      std::istream::operator>>(piVar6,iper._M_elems + 2);
      pTVar8 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        dVar13 = probsize._M_elems[lVar9] / (double)(npts._M_elems[lVar9] + -1);
        *(double *)((long)&pTVar8->npboxcells + lVar9 * 8 + local_390 + 0xffffffffffffffc8U) =
             dVar13;
        *(double *)((long)&pTVar8->npboxcells + lVar9 * 8 + local_390 + 0xffffffffffffffe0U) =
             1.0 / dVar13;
      }
      pTVar8 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar13 = probsize._M_elems[0] -
               (*(double *)((long)(pTVar8 + uVar11) + 0x48) +
               *(double *)((long)(pTVar8 + uVar11) + 0x48));
      *(double *)((long)(pTVar8 + uVar11) + 0x78) = dVar13;
      dVar14 = probsize._M_elems[1] -
               (*(double *)((long)(pTVar8 + uVar11) + 0x50) +
               *(double *)((long)(pTVar8 + uVar11) + 0x50));
      *(double *)((long)(pTVar8 + uVar11) + 0x80) = dVar14;
      *(double *)((long)(pTVar8 + uVar11) + 0x88) = probsize._M_elems[2];
      *(int *)((long)(pTVar8 + uVar11) + 0x20) = npts._M_elems[0] + -3;
      *(int *)((long)(pTVar8 + uVar11) + 0x24) = npts._M_elems[1] + -3;
      *(int *)((long)(pTVar8 + uVar11) + 0x28) = npts._M_elems[2];
      *(double *)((long)(pTVar8 + uVar11) + 0x30) =
           dVar13 * -0.5 +
           *turb_center.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
      *(double *)((long)(pTVar8 + uVar11) + 0x38) =
           dVar14 * -0.5 +
           turb_center.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      *(double *)((long)(pTVar8 + uVar11) + 0x40) = 0.0;
      local_360.field_2._M_allocated_capacity._4_4_ = *(int *)((long)(pTVar8 + uVar11) + 0xa0);
      local_360._M_dataplus._M_p = (pointer)0x100000001;
      local_360._M_string_length._0_4_ = 1;
      local_360._12_8_ = npts._M_elems._0_8_;
      local_360.field_2._8_4_ = 0;
      this_00 = (FArrayBox *)operator_new(0x48);
      ar = amrex::The_Async_Arena();
      amrex::FArrayBox::FArrayBox(this_00,(Box *)&local_360,3,ar);
      pTVar8 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(FArrayBox **)((long)(pTVar8 + uVar11) + 0xa8) = this_00;
      *(int *)((long)(pTVar8 + uVar11) + 0xf8) = npts._M_elems[2];
      if (*(bool *)((long)(pTVar8 + uVar11) + 0xc0) == true) {
        for (iVar4 = 0;
            pTVar8 = (this->tp).
                     super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                     .
                     super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            iVar4 < *(int *)((long)(pTVar8 + uVar11) + 0xf8); iVar4 = iVar4 + 1) {
          std::istream::_M_extract<double>((double *)&is);
        }
      }
      else {
        pTVar8 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<long,_std::allocator<long>_>::resize
                ((vector<long,_std::allocator<long>_> *)((long)(pTVar8 + uVar11) + 0xe0),
                 (long)*(int *)((long)(pTVar8 + uVar11) + 0xf8) * 3);
      pTVar8 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(long **)((long)(pTVar8 + uVar11) + 0x100) = *(long **)((long)(pTVar8 + uVar11) + 0xe0);
      lVar9 = (long)*(pointer *)((long)(pTVar8 + uVar11) + 0xe8) -
              (long)*(long **)((long)(pTVar8 + uVar11) + 0xe0) >> 3;
      *(long *)((long)(pTVar8 + uVar11) + 0x108) = lVar9;
      for (lVar10 = 0; lVar10 < lVar9; lVar10 = lVar10 + 1) {
        std::istream::_M_extract<long>((long *)&is);
        lVar9 = *(long *)((long)((this->tp).
                                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 .
                                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar11) + 0x108);
      }
      std::ifstream::close();
      std::ifstream::~ifstream((Print *)&is);
      std::__cxx11::string::~string((string *)&turb_header);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&turb_center);
      std::__cxx11::string::~string((string *)&side);
    }
    this->turbinflow_initialized = true;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pp);
    local_390 = local_390 + 0x110;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tp_list.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ppr);
  return extraout_EAX;
}

Assistant:

void
TurbInflow::init(amrex::Geometry const& /*geom*/)
{
  amrex::ParmParse ppr;

  int n_tp = 0;
  n_tp = ppr.countval("turbinflows");
  amrex::Vector<std::string> tp_list;
  if (n_tp > 0) {
    tp.resize(n_tp);
    tp_list.resize(n_tp);
    for (int n = 0; n < n_tp; n++) {
      ppr.get("turbinflows", tp_list[n], n);
    }
  }

  for (int n = 0; n < n_tp; n++) {

    amrex::ParmParse pp("turbinflow." + tp_list[n]);
    if (pp.countval("turb_file") > 0) {

      // Query data
      pp.query("turb_file", tp[n].m_turb_file);
      tp[n].dir = -1;
      pp.query("dir", tp[n].dir);
      AMREX_ASSERT_WITH_MESSAGE(
        tp[n].dir >= 0 && tp[n].dir < AMREX_SPACEDIM,
        "Injection direction is needed: 0, 1 or 2");
      std::string side;
      pp.query("side", side);
      if (side == "low") {
        tp[n].side = amrex::Orientation::low;
      } else if (side == "high") {
        tp[n].side = amrex::Orientation::high;
      } else {
        amrex::Abort("turbinflow.side can only be low or high");
      }
      pp.query("time_offset", tp[n].time_shift);
      pp.query("turb_scale_loc", tp[n].turb_scale_loc);
      pp.query("turb_scale_vel", tp[n].turb_scale_vel);
      amrex::Print() << "Initializing turbInflow " << tp_list[n]
                     << " with file " << tp[n].m_turb_file
                     << " (location coordinates in will be scaled by "
                     << tp[n].turb_scale_loc
                     << " and velocity out to be scaled by "
                     << tp[n].turb_scale_vel << ") \n";

      // Get the turbcenter on the injection face
      amrex::Vector<amrex::Real> turb_center(AMREX_SPACEDIM - 1, 0);
      pp.getarr("turb_center", turb_center);
      AMREX_ASSERT_WITH_MESSAGE(
        turb_center.size() == AMREX_SPACEDIM - 1,
        "turb_center must have AMREX_SPACEDIM-1 elements");
      for (int idim = 0; idim < turb_center.size(); ++idim) {
        turb_center[idim] *= tp[n].turb_scale_loc;
      }

      pp.query("turb_nplane", tp[n].nplane);
      AMREX_ASSERT(tp[n].nplane > 0);
      pp.query("turb_conv_vel", tp[n].turb_conv_vel);
      AMREX_ASSERT(tp[n].turb_conv_vel > 0);

      // Set other stuff
      std::string turb_header = tp[n].m_turb_file + "/HDR";
      std::ifstream is(turb_header.c_str());
      if (!is.is_open()) {
        amrex::Abort("Unable to open input file " + turb_header);
      }
      amrex::Array<int, AMREX_SPACEDIM> npts = {{0}};
      amrex::Array<amrex::Real, AMREX_SPACEDIM> probsize = {{0}};
      amrex::Array<int, AMREX_SPACEDIM> iper = {{0}};
      is >> npts[0] >> npts[1] >> npts[2];
      is >> probsize[0] >> probsize[1] >> probsize[2];
      is >> iper[0] >> iper[1] >>
        iper[2]; // Unused - we assume it is always fully periodic

      for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        tp[n].dx[idim] = probsize[idim] / amrex::Real(npts[idim] - 1);
        tp[n].dxinv[idim] = 1.0 / tp[n].dx[idim];
      }

      // The following is relative to the injection face:
      // 0 and 1 are transverse directions, 2 is normal
      // one ghost point on each side, tangential to inflow face
      tp[n].pboxsize[0] = probsize[0] - 2.0 * tp[n].dx[0];
      tp[n].pboxsize[1] = probsize[1] - 2.0 * tp[n].dx[1];
      tp[n].pboxsize[2] = probsize[2];

      tp[n].npboxcells[0] = npts[0] - 3;
      tp[n].npboxcells[1] = npts[1] - 3;
      tp[n].npboxcells[2] = npts[2];

      // Center the turbulence
      tp[n].pboxlo[0] = turb_center[0] - 0.5 * tp[n].pboxsize[0];
      tp[n].pboxlo[1] = turb_center[1] - 0.5 * tp[n].pboxsize[1];
      tp[n].pboxlo[2] = 0.;

      amrex::Box sbx(
        amrex::IntVect(AMREX_D_DECL(1, 1, 1)),
        amrex::IntVect(AMREX_D_DECL(npts[0], npts[1], tp[n].nplane)));

      tp[n].sdata = new amrex::FArrayBox(sbx, 3, amrex::The_Async_Arena());

      tp[n].kmax = npts[2];

      if (tp[n].isswirltype) {
        for (int i = 0; i < tp[n].kmax; i++) {
          amrex::Real rdummy = 0.0;
          is >> rdummy; // Time for each plane - unused at the moment
        }
      }

      // Offset for each plane in Binary TurbFile
      tp[n].m_offset.resize(tp[n].kmax * AMREX_SPACEDIM);
      tp[n].offset = tp[n].m_offset.data();
      tp[n].offset_size = tp[n].m_offset.size();
      for (int i = 0; i < tp[n].offset_size; i++) {
        is >> tp[n].offset[i];
      }
      is.close();
    }
    turbinflow_initialized = true;
  }
}